

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

Vec_Int_t *
findNewDisjunctiveMonotone
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  Aig_Man_t *pAig_00;
  Vec_Int_t *p;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int poMarker;
  Pdr_Par_t Pars;
  int local_f4;
  Pdr_Par_t local_f0;
  
  uVar2 = aigPoIndicesArg->attrPendingSignalIndex;
  pAig_00 = createDisjunctiveMonotoneTester(pAig,aigPoIndicesArg,anteConseVectors,&local_f4);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0;
  p->nSize = 0;
  p->pArray = (int *)0x0;
  iVar5 = pAig_00->nTruePos;
  if (0 < (long)iVar5) {
    pVVar6 = pAig_00->vCos;
    uVar3 = pVVar6->nSize;
    uVar9 = 0;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar9;
    }
    do {
      if (uVar7 == uVar9) goto LAB_005fc437;
      pvVar4 = pVVar6->pArray[uVar9];
      if (((ulong)pvVar4 & 1) != 0) goto LAB_005fc456;
      pbVar1 = (byte *)((long)pvVar4 + 8);
      *pbVar1 = *pbVar1 ^ 1;
      uVar9 = uVar9 + 1;
    } while ((long)iVar5 != uVar9);
  }
  Pdr_ManSetDefaultParams(&local_f0);
  local_f0.fVerbose = 0;
  local_f0.fNotVerbose = 1;
  local_f0.fSolveAll = 1;
  pAig_00->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Pdr_ManSolve(pAig_00,&local_f0);
  if ((pAig_00->vSeqModelVec != (Vec_Ptr_t *)0x0) &&
     (pVVar6 = pAig_00->vSeqModelVec, 0 < pVVar6->nSize)) {
    lVar8 = 0;
    do {
      if ((int)uVar2 < lVar8 && pVVar6->pArray[lVar8] == (void *)0x0) {
        uVar7 = (ulong)~uVar2 + lVar8;
        iVar5 = (int)uVar7;
        if ((iVar5 < 0) || (anteConseVectors->attrConsequentCandidates->nSize <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p,anteConseVectors->attrConsequentCandidates->pArray[uVar7 & 0xffffffff]);
      }
      lVar8 = lVar8 + 1;
      pVVar6 = pAig_00->vSeqModelVec;
    } while (lVar8 < pVVar6->nSize);
  }
  iVar5 = pAig_00->nTruePos;
  if (0 < (long)iVar5) {
    pVVar6 = pAig_00->vCos;
    uVar2 = pVVar6->nSize;
    uVar9 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar9;
    }
    do {
      if (uVar7 == uVar9) {
LAB_005fc437:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar6->pArray[uVar9];
      if (((ulong)pvVar4 & 1) != 0) {
LAB_005fc456:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                      ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
      }
      pbVar1 = (byte *)((long)pvVar4 + 8);
      *pbVar1 = *pbVar1 ^ 1;
      uVar9 = uVar9 + 1;
    } while ((long)iVar5 != uVar9);
  }
  Aig_ManStop(pAig_00);
  if (p->nSize < 1) {
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    p = (Vec_Int_t *)0x0;
  }
  return p;
}

Assistant:

Vec_Int_t *findNewDisjunctiveMonotone( Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct antecedentConsequentVectorsStruct *anteConseVectors )
{
    Aig_Man_t *pAigNew;
    Aig_Obj_t *pObjTargetPo;
    int poMarker;
    //int i, RetValue, poSerialNum;
    int i, poSerialNum;
    Pdr_Par_t Pars, * pPars = &Pars;
    //Abc_Cex_t * pCex = NULL;
    Vec_Int_t *vMonotoneIndex;
    //char fileName[20];
    Abc_Cex_t * cexElem;

    int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

    pAigNew = createDisjunctiveMonotoneTester(pAig, aigPoIndicesArg, anteConseVectors, &poMarker );

    //printf("enter an integer : ");
    //waitForInteger = getchar();
    //putchar(waitForInteger);

    vMonotoneIndex = Vec_IntAlloc(0);

    for( i=0; i<Saig_ManPoNum(pAigNew); i++ )
    {
        pObjTargetPo = Aig_ManCo( pAigNew, i );
        Aig_ObjChild0Flip( pObjTargetPo );
    }

    Pdr_ManSetDefaultParams( pPars );
    pPars->fVerbose = 0;
    pPars->fNotVerbose = 1;
    pPars->fSolveAll = 1;
    pAigNew->vSeqModelVec = NULL;
    Pdr_ManSolve( pAigNew, pPars );    

    if( pAigNew->vSeqModelVec )
    {
        Vec_PtrForEachEntry( Abc_Cex_t *, pAigNew->vSeqModelVec, cexElem, i )
        {
            if( cexElem == NULL  && i >= pendingSignalIndexLocal + 1)
            {
                poSerialNum = i - (pendingSignalIndexLocal + 1);
                Vec_IntPush( vMonotoneIndex, Vec_IntEntry( anteConseVectors->attrConsequentCandidates, poSerialNum ));
            }
        }
    }
    for( i=0; i<Saig_ManPoNum(pAigNew); i++ )
    {
        pObjTargetPo = Aig_ManCo( pAigNew, i );
        Aig_ObjChild0Flip( pObjTargetPo );
    }
    
    //if(pAigNew->vSeqModelVec)
    //    Vec_PtrFree(pAigNew->vSeqModelVec);

    Aig_ManStop(pAigNew);
    
    if( Vec_IntSize( vMonotoneIndex ) > 0 )
    {
        return vMonotoneIndex;
    }
    else
    {
        Vec_IntFree(vMonotoneIndex);
        return NULL;
    }
}